

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O0

DynamicType * __thiscall Js::ES5Array::DuplicateType(ES5Array *this)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  DynamicType *this_01;
  DynamicType *type;
  TrackAllocData local_38;
  ES5Array *local_10;
  ES5Array *this_local;
  
  local_10 = this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&ES5ArrayType::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ES5Array.cpp"
             ,0x12);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_38);
  this_01 = (DynamicType *)new<Memory::Recycler>(0x38,pRVar1,0x43c4b0);
  type = DynamicObject::GetDynamicType((DynamicObject *)this);
  ES5ArrayType::ES5ArrayType((ES5ArrayType *)this_01,type);
  return this_01;
}

Assistant:

DynamicType* ES5Array::DuplicateType()
    {
        return RecyclerNew(GetScriptContext()->GetRecycler(), ES5ArrayType, this->GetDynamicType());
    }